

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

size_t __thiscall
XPMP2::UDPMulticast::RecvMC
          (UDPMulticast *this,bool bSwitchToRecvIntf,string *_pFromAddr,SockAddrTy *_pFromSockAddr,
          bool *_pbIntfChanged)

{
  char *__s;
  string *this_00;
  bool bVar1;
  size_t sVar2;
  int *piVar3;
  mapped_type *pmVar4;
  long lVar5;
  rep rVar6;
  cmsghdr *__cmsg;
  NetRuntimeError *pNVar7;
  ushort uVar8;
  uint32_t idx;
  allocator<char> local_4d9;
  bool *local_4d8;
  string *local_4d0;
  SockAddrTy sa;
  string local_4a0;
  msghdr msg;
  iovec iovec;
  char msg_control [1024];
  
  local_4d8 = _pbIntfChanged;
  local_4d0 = _pFromAddr;
  if (((this->pMCAddr == (addrinfo *)0x0) ||
      (__s = (this->super_SocketNetworking).buf, __s == (char *)0x0)) ||
     ((this->super_SocketNetworking).f_socket == -1)) {
    pNVar7 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)msg_control,"RecvMC: Multicast socket not initialized",
               (allocator<char> *)&msg);
    NetRuntimeError::NetRuntimeError(pNVar7,(string *)msg_control);
    __cxa_throw(pNVar7,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  sa.field_0._16_4_ = 0;
  sa.field_0._20_8_ = 0;
  sa.field_0._8_4_ = 0;
  sa.field_0._12_4_ = 0;
  uVar8 = CONCAT11(0,(byte)this->pMCAddr->ai_family);
  sa.field_0._2_6_ = 0;
  sa.field_0.sa.sa_family = uVar8;
  idx = 0;
  memset(__s,0,(this->super_SocketNetworking).bufSize);
  iovec.iov_base = (this->super_SocketNetworking).buf;
  msg.msg_iov = &iovec;
  iovec.iov_len = (this->super_SocketNetworking).bufSize;
  msg.msg_namelen = 0x10;
  if (uVar8 == 10) {
    msg.msg_namelen = 0x1c;
  }
  msg.msg_iovlen = 1;
  msg.msg_control = msg_control;
  msg.msg_controllen = 0x400;
  msg.msg_flags = 0;
  msg.msg_name = &sa;
  sVar2 = recvmsg((this->super_SocketNetworking).f_socket,(msghdr *)&msg,0);
  if ((long)sVar2 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 0xb) {
      pNVar7 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a0,"RecvMC: recvfrom failed",&local_4d9);
      NetRuntimeError::NetRuntimeError(pNVar7,&local_4a0);
      __cxa_throw(pNVar7,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
    }
    sVar2 = 0;
LAB_001fecb5:
    idx = 0;
  }
  else if (bSwitchToRecvIntf && sVar2 != 0) {
    __cmsg = (cmsghdr *)msg.msg_control;
    if (msg.msg_controllen < 0x10) {
      __cmsg = (cmsghdr *)0x0;
    }
    lVar5 = 0x20;
    for (; __cmsg != (cmsghdr *)0x0; __cmsg = __cmsg_nxthdr((msghdr *)&msg,__cmsg)) {
      if (sa.field_0.sa.sa_family._0_1_ == '\n') {
        if ((__cmsg->cmsg_level == 0x29) && (__cmsg->cmsg_type == 0x32)) goto LAB_001fedd5;
      }
      else if ((sa.field_0.sa.sa_family._0_1_ == '\x02') &&
              ((__cmsg->cmsg_level == 0 && (__cmsg->cmsg_type == 8)))) {
        lVar5 = 0x10;
LAB_001fedd5:
        idx = *(uint32_t *)((long)&__cmsg->cmsg_len + lVar5);
        goto LAB_001fecb8;
      }
    }
    goto LAB_001fecb5;
  }
LAB_001fecb8:
  if (bSwitchToRecvIntf) {
    pmVar4 = std::
             map<XPMP2::SockAddrTy,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::less<XPMP2::SockAddrTy>,_std::allocator<std::pair<const_XPMP2::SockAddrTy,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
             ::operator[](&this->mapSender,&sa);
    lVar5 = std::chrono::_V2::steady_clock::now();
    if (lVar5 - (pmVar4->__d).__r < 180000000000) {
      idx = 0;
    }
    rVar6 = std::chrono::_V2::steady_clock::now();
    (pmVar4->__d).__r = rVar6;
  }
  this_00 = local_4d0;
  if (((bSwitchToRecvIntf) && (idx != 0)) && (idx != this->oneIntfIdx)) {
    SendToIntf(this,idx);
    bVar1 = true;
    if (local_4d8 == (bool *)0x0) goto LAB_001fed2f;
  }
  else {
    if (local_4d8 == (bool *)0x0) goto LAB_001fed2f;
    bVar1 = false;
  }
  *local_4d8 = bVar1;
LAB_001fed2f:
  if (this_00 != (string *)0x0) {
    SocketNetworking::GetAddrString_abi_cxx11_
              (&local_4a0,(SocketNetworking *)&sa,(SockAddrTy *)0x1,SUB81(local_4d8,0));
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
  }
  if (_pFromSockAddr != (SockAddrTy *)0x0) {
    *(ulong *)((long)&_pFromSockAddr->field_0 + 0xc) = CONCAT44(sa.field_0._16_4_,sa.field_0._12_4_)
    ;
    *(undefined8 *)((long)&_pFromSockAddr->field_0 + 0x14) = sa.field_0._20_8_;
    *(undefined8 *)&_pFromSockAddr->field_0 = sa.field_0._0_8_;
    *(ulong *)((long)&_pFromSockAddr->field_0 + 8) = CONCAT44(sa.field_0._12_4_,sa.field_0._8_4_);
  }
  return sVar2;
}

Assistant:

size_t UDPMulticast::RecvMC (bool bSwitchToRecvIntf,
                             std::string* _pFromAddr,
                             SockAddrTy* _pFromSockAddr,
                             bool* _pbIntfChanged)
{

    if (!pMCAddr || !buf || !isOpen())
        throw NetRuntimeError("RecvMC: Multicast socket not initialized");
    
    // Information vairables filled during the rcvmsg operation
    SockAddrTy sa;                              // socket address
    sa.sa.sa_family = GetFamily();
    uint32_t ifIdx = 0;                         // interface index the msg was received on

    memset(buf, 0, bufSize);
    ssize_t bytesRcvd = 0;
#if IBM
    // Set up msg header
    // Originally based on https://stackoverflow.com/a/37334943
    char msg_control[1024] = "";
    WSABUF  wsaBuf = { static_cast<ULONG>(bufSize), buf };
    DWORD br = 0;
    WSAMSG  msg = {
        &sa.sa,                 // LPSOCKADDR       name;              /* Remote address */
        sa.size(),              // INT              namelen;           /* Remote address length */
        &wsaBuf,                // LPWSABUF         lpBuffers;         /* Data buffer array */
        1,                      // ULONG            dwBufferCount;     /* Number of elements in the array */
        {                       // WSABUF           Control;           /* Control buffer */
            sizeof(msg_control),
            msg_control
        },
        0                       // ULONG            dwFlags;           /* Flags */
    };

    // Receive the message, fill the control info
    if (WSARecvMsg(&msg, &br, nullptr, nullptr) < 0) {
        if (errno != WSAEWOULDBLOCK)            // we ignore no-data events
            throw NetRuntimeError("RecvMC: WSARecvMsg failed");
    }
    bytesRcvd = (ssize_t)br;

    // loop the control headers to find which interface the msg was received on
    if (bytesRcvd > 0 && bSwitchToRecvIntf) {
        for (WSACMSGHDR* cmsg = WSA_CMSG_FIRSTHDR(&msg);
             cmsg;
             cmsg = WSA_CMSG_NXTHDR(&msg, cmsg))
        {
            if (sa.isIp4() && cmsg->cmsg_level == IPPROTO_IP && cmsg->cmsg_type == IP_PKTINFO)
            {
                const struct in_pktinfo* in_pktinfo = (struct in_pktinfo*)WSA_CMSG_DATA(cmsg);
                ifIdx = in_pktinfo->ipi_ifindex;
                break;
            }
            if (sa.isIp6() && cmsg->cmsg_level == IPPROTO_IPV6 && cmsg->cmsg_type == IPV6_PKTINFO)
            {
                const struct in6_pktinfo* in6_pktinfo = (struct in6_pktinfo*)WSA_CMSG_DATA(cmsg);
                ifIdx = in6_pktinfo->ipi6_ifindex;
                break;
            }
        }
    }

#else
    // Set up msg header
    // Originally based on https://stackoverflow.com/a/12398774
    char msg_control[1024];
    struct iovec iovec = { buf, bufSize };
    struct msghdr msg = {
        &sa.sa,                 //    void            *msg_name;      /* [XSI] optional address */
        sa.size(),              //    socklen_t       msg_namelen;    /* [XSI] size of address */
        &iovec,                 //    struct          iovec *msg_iov; /* [XSI] scatter/gather array */
        1,                      //    int             msg_iovlen;     /* [XSI] # elements in msg_iov */
        msg_control,            //    void            *msg_control;   /* [XSI] ancillary data, see below */
        sizeof(msg_control),    //    socklen_t       msg_controllen; /* [XSI] ancillary data buffer len */
        0                       //    int             msg_flags;      /* [XSI] flags on received message */
    };

    // Receive the message, fill the control info
    bytesRcvd = recvmsg(f_socket, &msg, 0);
    // We don't treat EAGAIN as an error...that just means we received nothing
    if (bytesRcvd < 0 && errno == EAGAIN)
        bytesRcvd = 0;
    if (bytesRcvd < 0)
        throw NetRuntimeError("RecvMC: recvfrom failed");

    // loop the control headers to find which interface the msg was received on
    if (bytesRcvd > 0 && bSwitchToRecvIntf) {
        for (struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg); cmsg != 0; cmsg = CMSG_NXTHDR(&msg, cmsg))
        {
            if (sa.isIp4() && cmsg->cmsg_level == IPPROTO_IP && cmsg->cmsg_type == IP_PKTINFO)
            {
                const struct in_pktinfo* in_pktinfo = (struct in_pktinfo*)CMSG_DATA(cmsg);
                ifIdx = in_pktinfo->ipi_ifindex;
                break;
            }
            if (sa.isIp6() && cmsg->cmsg_level == IPPROTO_IPV6 && cmsg->cmsg_type == IPV6_PKTINFO)
            {
                const struct in6_pktinfo* in6_pktinfo = (struct in6_pktinfo*)CMSG_DATA(cmsg);
                ifIdx = in6_pktinfo->ipi6_ifindex;
                break;
            }
        }
    }
#endif
    
    // Was that packet send from someplace we didn't hear yet or in some time?
    if (bSwitchToRecvIntf) {
        std::chrono::time_point<std::chrono::steady_clock> &lastRcvd = mapSender[sa];
        if (std::chrono::steady_clock::now() - lastRcvd < std::chrono::seconds(180))
            ifIdx = 0;                      // we know that sender and have heard from it in past 3 minutes, don't switch interface because of it
        lastRcvd = std::chrono::steady_clock::now();
    }
    
    // If requested, set outgoing interface (quick exit if no change)
    if (bSwitchToRecvIntf && ifIdx && ifIdx != oneIntfIdx) {
        SendToIntf(ifIdx);
        if (_pbIntfChanged) *_pbIntfChanged = true;
    }
    else
        if (_pbIntfChanged) *_pbIntfChanged = false;
        

    // Sender address wanted?
    if (_pFromAddr)
        *_pFromAddr = GetAddrString(sa);
    if (_pFromSockAddr)
        *_pFromSockAddr = sa;
    
    return size_t(bytesRcvd);
}